

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_RenderContent * ON_RenderContentPrivate::NewRenderContentFromNode(ON_XMLNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_wString *kind;
  ON_RenderContent *rc;
  ON_XMLNode *node_local;
  ON_wString *rhs;
  
  kind = (ON_wString *)0x0;
  iVar2 = (*node->_vptr_ON_XMLNode[3])();
  rhs = (ON_wString *)CONCAT44(extraout_var,iVar2);
  bVar1 = ::operator==(L"material",rhs);
  if (bVar1) {
    kind = (ON_wString *)operator_new(0x240);
    ON_RenderMaterial::ON_RenderMaterial((ON_RenderMaterial *)kind);
  }
  else {
    bVar1 = ::operator==(L"environment",rhs);
    if (bVar1) {
      kind = (ON_wString *)operator_new(0x240);
      ON_RenderEnvironment::ON_RenderEnvironment((ON_RenderEnvironment *)kind);
    }
    else {
      bVar1 = ::operator==(L"texture",rhs);
      if (bVar1) {
        kind = (ON_wString *)operator_new(0x240);
        ON_RenderTexture::ON_RenderTexture((ON_RenderTexture *)kind);
      }
    }
  }
  if (kind != (ON_wString *)0x0) {
    SetXMLNode((ON_RenderContentPrivate *)kind[0x12].m_s,node);
  }
  return (ON_RenderContent *)kind;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::NewRenderContentFromNode(const ON_XMLNode& node) // Static.
{
  ON_RenderContent* rc = nullptr;

  const ON_wString& kind = node.TagName();

  if (ON_KIND_MATERIAL == kind)
    rc = new ON_RenderMaterial;
  else
  if (ON_KIND_ENVIRONMENT == kind)
    rc = new ON_RenderEnvironment;
  else
  if (ON_KIND_TEXTURE == kind)
    rc = new ON_RenderTexture;

  if (nullptr != rc)
  {
    rc->_private->SetXMLNode(node);
  }

  return rc;
}